

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArHosekSkyModel.c
# Opt level: O0

double arhosekskymodel_solar_radiance
                 (ArHosekSkyModelState *state,double theta,double gamma,double wavelength)

{
  double in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double unaff_retaddr;
  double inscattered_radiance;
  double direct_radiance;
  double in_stack_000000e0;
  double in_stack_000000e8;
  double in_stack_000000f0;
  ArHosekSkyModelState *in_stack_000000f8;
  
  dVar1 = arhosekskymodel_solar_radiance_internal2
                    (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  dVar2 = arhosekskymodel_radiance
                    ((ArHosekSkyModelState *)inscattered_radiance,unaff_retaddr,in_RDI,in_XMM0_Qa);
  return dVar1 + dVar2;
}

Assistant:

double arhosekskymodel_solar_radiance(
        ArHosekSkyModelState  * state,
        double                  theta, 
        double                  gamma, 
        double                  wavelength
        )
{
    double  direct_radiance =
        arhosekskymodel_solar_radiance_internal2(
            state,
            wavelength,
            ((MATH_PI/2.0)-theta),
            gamma
            );

    double  inscattered_radiance =
        arhosekskymodel_radiance(
            state,
            theta,
            gamma,
            wavelength
            );
    
    return  direct_radiance + inscattered_radiance;
}